

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall
TextButton::TextButton
          (TextButton *this,string *buttonText,Color *textColor,uint charSize,float x,float y,
          Color *color1,Color *color2,function<void_(int)> *action,int actionOption)

{
  Font *font;
  uint in_ECX;
  undefined8 *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  FloatRect FVar1;
  undefined4 in_stack_00000010;
  Text *in_stack_fffffffffffffee8;
  Text *in_stack_fffffffffffffef0;
  RectangleShape *this_00;
  undefined1 in_stack_fffffffffffffef8 [16];
  Text *in_stack_ffffffffffffff08;
  undefined1 auVar2 [16];
  locale *this_01;
  string *ansiString;
  Text *this_02;
  float local_88;
  Vector2<float> local_80;
  locale local_78 [44];
  Vector2<float> local_4c [2];
  undefined4 *local_38;
  undefined4 *local_30;
  float local_24;
  float local_20;
  uint local_1c;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  local_1c = in_ECX;
  UIComponent::UIComponent(in_stack_fffffffffffffef8._8_8_);
  *in_RDI = &PTR__TextButton_002bc160;
  in_RDI[1] = &PTR__TextButton_002bc198;
  sf::Text::Text(in_stack_ffffffffffffff08);
  sf::Vector2<float>::Vector2(local_4c,0.0,0.0);
  sf::RectangleShape::RectangleShape
            (in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_);
  sf::Color::Color((Color *)(in_RDI + 0x70));
  sf::Color::Color((Color *)((long)in_RDI + 900));
  ansiString = (string *)(in_RDI + 0x71);
  std::function<void_(int)>::function((function<void_(int)> *)in_stack_fffffffffffffef0);
  this_02 = (Text *)(in_RDI + 0x17);
  font = Board::getFont();
  sf::Text::setFont(this_02,font);
  this_01 = local_78;
  std::locale::locale(this_01);
  sf::String::String((String *)this_02,ansiString,this_01);
  sf::Text::setString(in_stack_fffffffffffffef0,(String *)in_stack_fffffffffffffee8);
  sf::String::~String((String *)0x1a7949);
  std::locale::~locale(local_78);
  sf::Text::setFillColor(in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_);
  sf::Text::setCharacterSize((Text *)(in_RDI + 0x17),local_1c);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x18),5.0,0.0);
  this_00 = (RectangleShape *)(in_RDI + 0x45);
  FVar1 = sf::Text::getLocalBounds(in_stack_fffffffffffffee8);
  auVar2._8_4_ = extraout_XMM0_Dc;
  auVar2._0_8_ = FVar1._0_8_;
  auVar2._12_4_ = extraout_XMM0_Dd;
  local_88 = FVar1.width;
  sf::Vector2<float>::Vector2(&local_80,local_88 + 10.0,(float)local_1c * 1.5);
  sf::RectangleShape::setSize(this_00,(Vector2f *)in_stack_fffffffffffffee8);
  sf::Shape::setFillColor(&this_00->super_Shape,(Color *)in_stack_fffffffffffffee8);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x46),0.0,0.0);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 1),local_20,local_24);
  *(undefined4 *)(in_RDI + 0x70) = *local_30;
  *(undefined4 *)((long)in_RDI + 900) = *local_38;
  std::function<void_(int)>::operator=(auVar2._8_8_,auVar2._0_8_);
  *(undefined4 *)(in_RDI + 0x75) = in_stack_00000010;
  *(undefined1 *)((long)in_RDI + 0x3ac) = 0;
  return;
}

Assistant:

TextButton::TextButton(const string& buttonText, const Color& textColor, unsigned int charSize, float x, float y, const Color& color1, const Color& color2, function<void(int)> action, int actionOption) {
    text.setFont(Board::getFont());
    text.setString(buttonText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(5.0f, 0.0f);
    
    button.setSize(Vector2f(text.getLocalBounds().width + 10.0f, charSize * 1.5f));
    button.setFillColor(color1);
    button.setPosition(0.0f, 0.0f);
    
    setPosition(x, y);
    this->color1 = color1;
    this->color2 = color2;
    this->action = action;
    this->actionOption = actionOption;
    selected = false;
}